

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O3

TriangleMesh *
pbrt::LoopSubdivide(Transform *renderFromObject,bool reverseOrientation,int nLevels,
                   span<const_int> vertexIndices,span<const_pbrt::Point3<float>_> p,Allocator alloc)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  _Rb_tree_color _Var20;
  _func_int *p_Var21;
  mapped_type pSVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  pointer ppSVar25;
  int iVar26;
  SDFace *f_1;
  _func_int **pp_Var27;
  ulong uVar28;
  _func_int **pp_Var29;
  SDFace *pSVar30;
  SDFace *pSVar31;
  memory_resource *pmVar32;
  undefined4 extraout_var;
  undefined1 (*pauVar34) [64];
  mapped_type *ppSVar35;
  undefined4 extraout_var_01;
  pointer ppSVar36;
  pointer ppSVar37;
  SDVertex *pSVar38;
  iterator iVar39;
  mapped_type *pmVar40;
  float *pfVar41;
  undefined4 extraout_var_02;
  int *piVar42;
  int iVar43;
  size_t sVar44;
  ulong uVar45;
  int v0;
  long lVar46;
  pointer ppSVar47;
  size_type __n;
  uint uVar48;
  SDFace *pSVar49;
  int i_1;
  int i_2;
  long lVar50;
  long lVar51;
  _func_int **pp_Var52;
  pointer ppSVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar77 [56];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar86 [60];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  pair<std::_Rb_tree_iterator<pbrt::SDEdge>,_std::_Rb_tree_iterator<pbrt::SDEdge>_> pVar93;
  Point3f PVar94;
  bool reverseOrientation_local;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> newVertices;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> v;
  undefined1 local_258 [16];
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> Ns;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> f;
  SDVertex *vert;
  pointer local_200;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> pLimit;
  map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
  edgeVerts;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> faces;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> vertices;
  Allocator alloc_local;
  monotonic_buffer_resource resource;
  vector<int,_std::allocator<int>_> local_d8;
  undefined1 local_b8 [16];
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_a8;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> local_88;
  Transform *local_68;
  set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_> edges;
  SDVertex *pSVar33;
  undefined4 extraout_var_00;
  undefined1 extraout_var_03 [60];
  
  uVar54 = vertexIndices.n;
  piVar42 = vertexIndices.ptr;
  vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = p.n;
  uVar45 = 0xffffffffffffffff;
  if (SUB168(auVar58 * ZEXT816(0x28),8) == 0) {
    uVar45 = SUB168(auVar58 * ZEXT816(0x28),0);
  }
  reverseOrientation_local = reverseOrientation;
  alloc_local = alloc;
  local_68 = renderFromObject;
  pp_Var27 = (_func_int **)operator_new__(uVar45);
  if (p.n != 0) {
    pp_Var29 = pp_Var27;
    do {
      *pp_Var29 = (_func_int *)0x0;
      *(undefined4 *)(pp_Var29 + 1) = 0;
      pp_Var29[2] = (_func_int *)0x0;
      pp_Var29[3] = (_func_int *)0x0;
      *(undefined2 *)(pp_Var29 + 4) = 0;
      pp_Var29 = pp_Var29 + 5;
    } while (pp_Var29 != pp_Var27 + p.n * 5);
    if (p.n != 0) {
      sVar44 = p.n;
      pp_Var29 = pp_Var27;
      do {
        resource.upstreamResource._0_4_ = ((p.ptr)->super_Tuple3<pbrt::Point3,_float>).z;
        p_Var21 = *(_func_int **)&(p.ptr)->super_Tuple3<pbrt::Point3,_float>;
        resource.blockSize._0_4_ = 0;
        resource.blockSize._4_4_ = 0;
        resource.currentBlock.ptr._0_4_ = 0;
        resource.currentBlock.ptr._4_4_ = 0;
        resource.currentBlock.size._0_2_ = 0;
        *(undefined2 *)(pp_Var29 + 4) = 0;
        *pp_Var29 = p_Var21;
        *(float *)(pp_Var29 + 1) = resource.upstreamResource._0_4_;
        *(undefined4 *)((long)pp_Var29 + 0x1c) = 0;
        *(ulong *)((long)pp_Var29 + 0xc) = (ulong)resource.upstreamResource._4_4_;
        *(undefined8 *)((long)pp_Var29 + 0x14) = 0;
        resource.super_memory_resource._vptr_memory_resource = pp_Var29;
        std::vector<pbrt::SDVertex*,std::allocator<pbrt::SDVertex*>>::emplace_back<pbrt::SDVertex*>
                  ((vector<pbrt::SDVertex*,std::allocator<pbrt::SDVertex*>> *)&vertices,
                   (SDVertex **)&resource);
        pp_Var29 = pp_Var29 + 5;
        p.ptr = p.ptr + 1;
        sVar44 = sVar44 - 1;
      } while (sVar44 != 0);
    }
  }
  uVar55 = uVar54 / 3;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar55;
  uVar28 = SUB168(auVar59 * ZEXT816(0x50),0);
  uVar45 = 0xffffffffffffffff;
  if (SUB168(auVar59 * ZEXT816(0x50),8) == 0) {
    uVar45 = uVar28;
  }
  pp_Var29 = (_func_int **)operator_new__(uVar45);
  if (2 < uVar54) {
    memset(pp_Var29,0,((uVar28 - 0x50) / 0x50) * 0x50 + 0x50);
    uVar45 = uVar55;
    pp_Var52 = pp_Var29;
    do {
      resource.super_memory_resource._vptr_memory_resource = pp_Var52;
      std::vector<pbrt::SDFace*,std::allocator<pbrt::SDFace*>>::emplace_back<pbrt::SDFace*>
                ((vector<pbrt::SDFace*,std::allocator<pbrt::SDFace*>> *)&faces,(SDFace **)&resource)
      ;
      pp_Var52 = pp_Var52 + 10;
      uVar45 = uVar45 - 1;
    } while (uVar45 != 0);
    if (2 < uVar54) {
      uVar45 = 0;
      do {
        lVar46 = 0;
        pSVar30 = faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar45];
        do {
          pSVar38 = vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar42[lVar46]];
          pSVar30->v[lVar46] = pSVar38;
          lVar46 = lVar46 + 1;
          pSVar38->startFace = pSVar30;
        } while (lVar46 != 3);
        uVar45 = uVar45 + 1;
        piVar42 = piVar42 + 3;
      } while (uVar45 != uVar55);
      edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &edges._M_t._M_impl.super__Rb_tree_header._M_header;
      edges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      edges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      edges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      edges._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (2 < uVar54) {
        uVar45 = 0;
        do {
          pSVar30 = faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar45];
          lVar46 = 0;
          do {
            lVar50 = lVar46 + 1;
            pSVar38 = pSVar30->v[lVar46];
            lVar56 = 0;
            if (lVar46 != 2) {
              lVar56 = lVar50;
            }
            pSVar33 = pSVar30->v[lVar56];
            resource.super_memory_resource._vptr_memory_resource = (_func_int **)pSVar38;
            if (pSVar33 < pSVar38) {
              resource.super_memory_resource._vptr_memory_resource = (_func_int **)pSVar33;
            }
            if (pSVar38 < pSVar33) {
              pSVar38 = pSVar33;
            }
            resource.upstreamResource._0_4_ = SUB84(pSVar38,0);
            resource.upstreamResource._4_4_ = (uint)((ulong)pSVar38 >> 0x20);
            resource.blockSize._0_4_ = 0;
            resource.blockSize._4_4_ = 0;
            resource.currentBlock.ptr._0_4_ = 0;
            resource.currentBlock.ptr._4_4_ = 0;
            resource.currentBlock.size._0_2_ = 0xffff;
            resource.currentBlock.size._2_2_ = 0xffff;
            iVar39 = std::
                     _Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                     ::find((_Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                             *)&edges,(key_type *)&resource);
            auVar58 = in_ZMM1._0_16_;
            if ((_Rb_tree_header *)iVar39._M_node == &edges._M_t._M_impl.super__Rb_tree_header) {
              resource.blockSize._0_4_ = SUB84(pSVar30,0);
              resource.blockSize._4_4_ = (undefined4)((ulong)pSVar30 >> 0x20);
              resource.currentBlock.size._0_2_ = (undefined2)lVar46;
              resource.currentBlock.size._2_2_ = (undefined2)((ulong)lVar46 >> 0x10);
              std::
              _Rb_tree<pbrt::SDEdge,pbrt::SDEdge,std::_Identity<pbrt::SDEdge>,std::less<pbrt::SDEdge>,std::allocator<pbrt::SDEdge>>
              ::_M_insert_unique<pbrt::SDEdge_const&>
                        ((_Rb_tree<pbrt::SDEdge,pbrt::SDEdge,std::_Identity<pbrt::SDEdge>,std::less<pbrt::SDEdge>,std::allocator<pbrt::SDEdge>>
                          *)&edges,(SDEdge *)&resource);
            }
            else {
              iVar39 = std::
                       _Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                       ::find((_Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                               *)&edges,(key_type *)&resource);
              resource.super_memory_resource._vptr_memory_resource =
                   *(_func_int ***)(iVar39._M_node + 1);
              pSVar31 = (SDFace *)iVar39._M_node[1]._M_left;
              resource.upstreamResource._0_4_ = SUB84(iVar39._M_node[1]._M_parent,0);
              resource.upstreamResource._4_4_ = (uint)((ulong)iVar39._M_node[1]._M_parent >> 0x20);
              resource.blockSize._0_4_ = SUB84(pSVar31,0);
              resource.blockSize._4_4_ = (undefined4)((ulong)pSVar31 >> 0x20);
              resource.currentBlock.ptr._0_4_ = SUB84(iVar39._M_node[1]._M_right,0);
              resource.currentBlock.ptr._4_4_ =
                   (undefined4)((ulong)iVar39._M_node[1]._M_right >> 0x20);
              _Var20 = iVar39._M_node[2]._M_color;
              resource.currentBlock.size._0_2_ = (undefined2)_Var20;
              resource.currentBlock.size._2_2_ = (undefined2)(_Var20 >> 0x10);
              pSVar31->f[(int)_Var20] = pSVar30;
              pSVar30->f[lVar46] = pSVar31;
              in_ZMM1 = ZEXT1664(auVar58);
              pVar93 = std::
                       _Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                       ::equal_range((_Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                                      *)&edges,(key_type *)&resource);
              std::
              _Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
              ::_M_erase_aux((_Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                              *)&edges,(_Base_ptr)pVar93.first._M_node,
                             (_Base_ptr)pVar93.second._M_node);
            }
            lVar46 = lVar50;
          } while (lVar50 != 3);
          uVar45 = uVar45 + 1;
        } while (uVar45 != uVar55);
      }
      goto LAB_004acfe3;
    }
  }
  edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &edges._M_t._M_impl.super__Rb_tree_header._M_header;
  edges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  edges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  edges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  edges._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_004acfe3:
  if (p.n != 0) {
    sVar44 = 0;
    do {
      pSVar38 = vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                _M_impl.super__Vector_impl_data._M_start[sVar44];
      pSVar30 = pSVar38->startFace;
      do {
        pSVar30 = SDFace::nextFace(pSVar30,pSVar38);
        if (pSVar30 == (SDFace *)0x0) {
          pSVar38->boundary = true;
          goto LAB_004ad047;
        }
        pSVar31 = pSVar38->startFace;
      } while (pSVar30 != pSVar31);
      iVar43 = 6;
      pSVar38->boundary = false;
      do {
        pSVar31 = SDFace::nextFace(pSVar31,pSVar38);
        iVar43 = iVar43 + -1;
      } while (pSVar31 != pSVar38->startFace);
      if (iVar43 == 0) {
LAB_004ad08b:
        bVar57 = true;
      }
      else {
        if ((pSVar38->boundary & 1U) != 0) {
LAB_004ad047:
          pSVar30 = pSVar38->startFace;
          iVar43 = 0;
          do {
            iVar26 = iVar43;
            pSVar30 = SDFace::nextFace(pSVar30,pSVar38);
            iVar43 = iVar26 + 1;
          } while (pSVar30 != (SDFace *)0x0);
          pSVar30 = pSVar38->startFace;
          iVar26 = 3 - iVar26;
          do {
            pSVar30 = SDFace::prevFace(pSVar30,pSVar38);
            iVar26 = iVar26 + -1;
          } while (pSVar30 != (SDFace *)0x0);
          if (iVar26 == 0) goto LAB_004ad08b;
        }
        bVar57 = false;
      }
      sVar44 = sVar44 + 1;
      pSVar38->regular = bVar57;
    } while (sVar44 != p.n);
  }
  std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::vector(&f,&faces);
  std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::vector(&v,&vertices);
  pmVar32 = pstd::pmr::get_default_resource();
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&resource.usedBlocks;
  resource.super_memory_resource._vptr_memory_resource =
       (_func_int **)&PTR__monotonic_buffer_resource_031e58c0;
  resource.upstreamResource._0_4_ = SUB84(pmVar32,0);
  resource.upstreamResource._4_4_ = (uint)((ulong)pmVar32 >> 0x20);
  resource.availableBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&resource.availableBlocks;
  resource.blockSize._0_4_ = 0x40000;
  resource.blockSize._4_4_ = 0;
  resource.currentBlock.ptr._0_4_ = 0;
  resource.currentBlock.ptr._4_4_ = 0;
  resource.currentBlock.size._0_2_ = 0;
  resource.currentBlock.size._2_2_ = 0;
  resource.currentBlock.size._4_4_ = 0;
  resource.currentBlockPos = 0;
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node._M_size = 0;
  resource.availableBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node._M_size = 0;
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       resource.usedBlocks.
       super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  resource.availableBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       resource.availableBlocks.
       super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if (0 < nLevels) {
    iVar43 = 0;
    do {
      ppSVar36 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
      super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
      Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
      super__Vector_impl_data._0_16_ =
           newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
           _M_impl.super__Vector_impl_data._0_16_;
      for (ppSVar47 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          ppSVar37 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,
          ppSVar53 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_start, ppSVar47 != ppSVar36; ppSVar47 = ppSVar47 + 1
          ) {
        pSVar38 = *ppSVar47;
        iVar26 = (*resource.super_memory_resource._vptr_memory_resource[2])(&resource,0x28,8);
        pSVar33 = (SDVertex *)CONCAT44(extraout_var,iVar26);
        (pSVar33->p).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
        (pSVar33->p).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
        (pSVar33->p).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
        pSVar33->regular = false;
        pSVar33->boundary = false;
        pSVar33->startFace = (SDFace *)SUB168(ZEXT816(0) << 0x40,0);
        pSVar33->child = (SDVertex *)SUB168(ZEXT816(0) << 0x40,8);
        pSVar38->child = pSVar33;
        pSVar33->regular = pSVar38->regular;
        pSVar33->boundary = pSVar38->boundary;
        if (newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<pbrt::SDVertex*,std::allocator<pbrt::SDVertex*>>::
          _M_realloc_insert<pbrt::SDVertex*const&>
                    ((vector<pbrt::SDVertex*,std::allocator<pbrt::SDVertex*>> *)&newVertices,
                     (iterator)
                     newVertices.
                     super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl
                     .super__Vector_impl_data._M_finish,&pSVar38->child);
        }
        else {
          *newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = pSVar33;
          newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      for (; ppSVar36 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
          ppSVar47 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                     _M_impl.super__Vector_impl_data._M_start, ppSVar53 != ppSVar37;
          ppSVar53 = ppSVar53 + 1) {
        pSVar30 = *ppSVar53;
        lVar46 = 0;
        do {
          in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
          iVar26 = (*resource.super_memory_resource._vptr_memory_resource[2])(&resource,0x50,8);
          pauVar34 = (undefined1 (*) [64])CONCAT44(extraout_var_00,iVar26);
          *(undefined1 (*) [64])(*pauVar34 + 0x10) = ZEXT1664(ZEXT816(0) << 0x40);
          *pauVar34 = ZEXT1664(ZEXT816(0) << 0x40);
          *(undefined1 (**) [64])((long)pSVar30->children + lVar46) = pauVar34;
          if (Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
            std::vector<pbrt::SDFace*,std::allocator<pbrt::SDFace*>>::
            _M_realloc_insert<pbrt::SDFace*const&>
                      ((vector<pbrt::SDFace*,std::allocator<pbrt::SDFace*>> *)&Ns,
                       (iterator)
                       Ns.
                       super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (SDFace **)((long)pSVar30->children + lVar46));
          }
          else {
            *(undefined1 (**) [64])
             &(Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Normal3,_float> =
                 pauVar34;
            Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)&((Ns.
                             super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->
                           super_Tuple3<pbrt::Normal3,_float>).z;
          }
          lVar46 = lVar46 + 8;
        } while (lVar46 != 0x20);
      }
      while (ppSVar37 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish, ppSVar47 != ppSVar36) {
        pSVar38 = *ppSVar47;
        if (pSVar38->boundary == false) {
          if (pSVar38->regular == true) {
            auVar77 = ZEXT856(0);
            auVar86 = ZEXT1260(in_ZMM1._4_12_);
            PVar94 = weightOneRing(pSVar38,0.0625);
            in_ZMM1._0_4_ = PVar94.super_Tuple3<pbrt::Point3,_float>.z;
            in_ZMM1._4_60_ = auVar86;
            auVar72._0_8_ = PVar94.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar72._8_56_ = auVar77;
            auVar58 = auVar72._0_16_;
          }
          else {
            pSVar30 = pSVar38->startFace;
            iVar26 = 0;
            do {
              pSVar30 = SDFace::nextFace(pSVar30,pSVar38);
              iVar26 = iVar26 + 1;
            } while (pSVar30 != pSVar38->startFace);
            auVar86 = (undefined1  [60])0x0;
            auVar77 = (undefined1  [56])0x0;
            PVar94 = weightOneRing(pSVar38,(Float)((uint)(iVar26 == 3) * 0x3e400000 +
                                                  (uint)(iVar26 != 3) *
                                                  (int)(3.0 / ((float)iVar26 * 8.0))));
            in_ZMM1._0_4_ = PVar94.super_Tuple3<pbrt::Point3,_float>.z;
            in_ZMM1._4_60_ = auVar86;
            auVar75._0_8_ = PVar94.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar75._8_56_ = auVar77;
            auVar58 = auVar75._0_16_;
          }
        }
        else {
          auVar77 = ZEXT856(0);
          auVar86 = ZEXT1260(in_ZMM1._4_12_);
          PVar94 = weightBoundary(pSVar38,0.125);
          in_ZMM1._0_4_ = PVar94.super_Tuple3<pbrt::Point3,_float>.z;
          in_ZMM1._4_60_ = auVar86;
          auVar71._0_8_ = PVar94.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar71._8_56_ = auVar77;
          auVar58 = auVar71._0_16_;
        }
        pSVar38 = pSVar38->child;
        uVar10 = vmovlps_avx(auVar58);
        (pSVar38->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar10;
        (pSVar38->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar10 >> 0x20);
        (pSVar38->p).super_Tuple3<pbrt::Point3,_float>.z = in_ZMM1._0_4_;
        ppSVar47 = ppSVar47 + 1;
      }
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      ppSVar25 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      for (ppSVar53 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppSVar25, ppSVar53 != ppSVar37;
          ppSVar53 = ppSVar53 + 1) {
        pSVar30 = *ppSVar53;
        uVar45 = 0;
        do {
          uVar54 = uVar45 + 1;
          pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = &pSVar30->v[uVar45]->p;
          register0x00001200 = (SDFace * [2])(ZEXT816(0) << 0x40);
          uVar28 = 0;
          if (uVar54 != 3) {
            uVar28 = uVar54 & 0xffffffff;
          }
          pSVar38 = pSVar30->v[uVar28];
          pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar38 < pLimit.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start = &pSVar38->p;
          }
          if (pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish < pSVar38) {
            pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = &pSVar38->p;
          }
          in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
          ppSVar35 = std::
                     map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                     ::operator[]((map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                                   *)&edgeVerts._M_t,(key_type *)&pLimit);
          vert = *ppSVar35;
          if (vert == (mapped_type)0x0) {
            iVar26 = (*resource.super_memory_resource._vptr_memory_resource[2])(&resource,0x28,8);
            vert = (SDVertex *)CONCAT44(extraout_var_01,iVar26);
            (vert->p).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
            (vert->p).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
            (vert->p).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
            vert->regular = false;
            vert->boundary = false;
            vert->startFace = (SDFace *)0x0;
            vert->child = (SDVertex *)0x0;
            if (newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<pbrt::SDVertex*,std::allocator<pbrt::SDVertex*>>::
              _M_realloc_insert<pbrt::SDVertex*const&>
                        ((vector<pbrt::SDVertex*,std::allocator<pbrt::SDVertex*>> *)&newVertices,
                         (iterator)
                         newVertices.
                         super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&vert);
            }
            else {
              *newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
               _M_impl.super__Vector_impl_data._M_finish = vert;
              newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   newVertices.
                   super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            pSVar38 = vert;
            vert->regular = true;
            bVar57 = pSVar30->f[uVar45] == (SDFace *)0x0;
            vert->boundary = bVar57;
            vert->startFace = pSVar30->children[3];
            uVar1 = ((pLimit.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Point3,_float>)
                    .x;
            uVar11 = ((pLimit.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Point3,_float>
                     ).y;
            fVar61 = ((pLimit.
                       super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Point3,_float>
                     ).z;
            if (bVar57) {
              auVar84._0_4_ = (float)uVar1 * 0.5;
              auVar84._4_4_ = (float)uVar11 * 0.5;
              auVar84._8_8_ = 0;
              uVar10 = vmovlps_avx(auVar84);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar10;
              (vert->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar10 >> 0x20);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.z = fVar61 * 0.5;
              uVar6 = ((pLimit.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->
                      super_Tuple3<pbrt::Point3,_float>).x;
              uVar16 = ((pLimit.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super_Tuple3<pbrt::Point3,_float>).y;
              fVar61 = ((pLimit.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super_Tuple3<pbrt::Point3,_float>).z;
              uVar7 = (vert->p).super_Tuple3<pbrt::Point3,_float>.x;
              uVar17 = (vert->p).super_Tuple3<pbrt::Point3,_float>.y;
              auVar79._0_4_ = (float)uVar6 * 0.5 + (float)uVar7;
              auVar79._4_4_ = (float)uVar16 * 0.5 + (float)uVar17;
              auVar79._8_8_ = 0;
              in_ZMM1 = ZEXT1664(auVar79);
              uVar10 = vmovlps_avx(auVar79);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar10;
              (vert->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar10 >> 0x20);
              fVar61 = fVar61 * 0.5 + (vert->p).super_Tuple3<pbrt::Point3,_float>.z;
            }
            else {
              lVar46 = 0;
              auVar78._0_4_ = (float)uVar1 * 0.375;
              auVar78._4_4_ = (float)uVar11 * 0.375;
              auVar78._8_8_ = 0;
              uVar10 = vmovlps_avx(auVar78);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar10;
              (vert->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar10 >> 0x20);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.z = fVar61 * 0.375;
              uVar2 = ((pLimit.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->
                      super_Tuple3<pbrt::Point3,_float>).x;
              uVar12 = ((pLimit.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super_Tuple3<pbrt::Point3,_float>).y;
              fVar61 = ((pLimit.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super_Tuple3<pbrt::Point3,_float>).z;
              uVar3 = (vert->p).super_Tuple3<pbrt::Point3,_float>.x;
              uVar13 = (vert->p).super_Tuple3<pbrt::Point3,_float>.y;
              auVar63._0_4_ = (float)uVar2 * 0.375 + (float)uVar3;
              auVar63._4_4_ = (float)uVar12 * 0.375 + (float)uVar13;
              auVar63._8_8_ = 0;
              uVar10 = vmovlps_avx(auVar63);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar10;
              (vert->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar10 >> 0x20);
              fVar61 = fVar61 * 0.375 + (vert->p).super_Tuple3<pbrt::Point3,_float>.z;
              (vert->p).super_Tuple3<pbrt::Point3,_float>.z = fVar61;
              while (pSVar33 = pSVar30->v[lVar46],
                    pSVar33 ==
                    (SDVertex *)
                    pLimit.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish ||
                    pSVar33 ==
                    (SDVertex *)
                    pLimit.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                lVar46 = lVar46 + 1;
                if (lVar46 == 3) {
                  LogFatal(Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/loopsubdiv.cpp"
                           ,0x44,"Basic logic error in SDVertex::otherVert()");
                }
              }
              uVar4 = (pSVar33->p).super_Tuple3<pbrt::Point3,_float>.x;
              uVar14 = (pSVar33->p).super_Tuple3<pbrt::Point3,_float>.y;
              auVar89._4_4_ = uVar14;
              auVar89._0_4_ = uVar4;
              auVar89._8_8_ = 0;
              auVar23._8_4_ = 0x3e000000;
              auVar23._0_8_ = 0x3e0000003e000000;
              auVar23._12_4_ = 0x3e000000;
              auVar58 = vmulps_avx512vl(auVar89,auVar23);
              lVar46 = 0;
              auVar64._0_4_ = auVar63._0_4_ + auVar58._0_4_;
              auVar64._4_4_ = auVar63._4_4_ + auVar58._4_4_;
              auVar64._8_4_ = auVar58._8_4_ + 0.0;
              auVar64._12_4_ = auVar58._12_4_ + 0.0;
              fVar61 = fVar61 + (pSVar33->p).super_Tuple3<pbrt::Point3,_float>.z * 0.125;
              in_ZMM1 = ZEXT464((uint)fVar61);
              uVar10 = vmovlps_avx(auVar64);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar10;
              (vert->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar10 >> 0x20);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.z = fVar61;
              while (pSVar33 = pSVar30->f[uVar45]->v[lVar46],
                    pSVar33 ==
                    (SDVertex *)
                    pLimit.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish ||
                    pSVar33 ==
                    (SDVertex *)
                    pLimit.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                lVar46 = lVar46 + 1;
                if (lVar46 == 3) {
                  LogFatal(Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/loopsubdiv.cpp"
                           ,0x44,"Basic logic error in SDVertex::otherVert()");
                }
              }
              uVar5 = (pSVar33->p).super_Tuple3<pbrt::Point3,_float>.x;
              uVar15 = (pSVar33->p).super_Tuple3<pbrt::Point3,_float>.y;
              auVar90._4_4_ = uVar15;
              auVar90._0_4_ = uVar5;
              auVar90._8_8_ = 0;
              auVar24._8_4_ = 0x3e000000;
              auVar24._0_8_ = 0x3e0000003e000000;
              auVar24._12_4_ = 0x3e000000;
              auVar58 = vmulps_avx512vl(auVar90,auVar24);
              fVar60 = (pSVar33->p).super_Tuple3<pbrt::Point3,_float>.z;
              auVar65._0_4_ = auVar64._0_4_ + auVar58._0_4_;
              auVar65._4_4_ = auVar64._4_4_ + auVar58._4_4_;
              auVar65._8_4_ = auVar64._8_4_ + auVar58._8_4_;
              auVar65._12_4_ = auVar64._12_4_ + auVar58._12_4_;
              uVar10 = vmovlps_avx(auVar65);
              (vert->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar10;
              (vert->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar10 >> 0x20);
              fVar61 = fVar61 + fVar60 * 0.125;
            }
            (vert->p).super_Tuple3<pbrt::Point3,_float>.z = fVar61;
            ppSVar35 = std::
                       map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                       ::operator[]((map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                                     *)&edgeVerts._M_t,(key_type *)&pLimit);
            *ppSVar35 = pSVar38;
          }
          uVar45 = uVar54;
        } while (uVar54 != 3);
        ppSVar25 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      auVar58 = in_ZMM1._0_16_;
      for (ppSVar36 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          ppSVar36 !=
          v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppSVar36 = ppSVar36 + 1) {
        pSVar38 = *ppSVar36;
        lVar46 = 0;
        while (pSVar38->startFace->v[lVar46] != pSVar38) {
          lVar46 = lVar46 + 1;
          if (lVar46 == 3) {
            LogFatal(Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/loopsubdiv.cpp"
                     ,0x39,"Basic logic error in SDFace::vnum()");
          }
        }
        pSVar38->child->startFace = pSVar38->startFace->children[lVar46];
      }
      ppSVar37 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
          super__Vector_impl_data._M_start != ppSVar25) {
        do {
          pSVar30 = *ppSVar37;
          uVar45 = 0;
          do {
            uVar54 = uVar45 + 1;
            uVar28 = uVar54 & 0xffffffff;
            if (uVar54 == 3) {
              uVar28 = 0;
            }
            pSVar30->children[3]->f[uVar45] = pSVar30->children[uVar28];
            pSVar30->children[uVar45]->f[uVar28] = pSVar30->children[3];
            pSVar49 = (SDFace *)0x0;
            pSVar31 = pSVar30->f[uVar45];
            if (pSVar31 != (SDFace *)0x0) {
              lVar46 = 0;
              while (pSVar31->v[lVar46] != pSVar30->v[uVar45]) {
                lVar46 = lVar46 + 1;
                if (lVar46 == 3) goto LAB_004ae3aa;
              }
              pSVar49 = pSVar31->children[lVar46];
            }
            pSVar30->children[uVar45]->f[uVar45] = pSVar49;
            uVar48 = ((int)uVar45 + 2U) % 3;
            pSVar31 = pSVar30->f[uVar48];
            if (pSVar31 == (SDFace *)0x0) {
              pSVar31 = (SDFace *)0x0;
            }
            else {
              lVar46 = 0;
              while (pSVar31->v[lVar46] != pSVar30->v[uVar45]) {
                lVar46 = lVar46 + 1;
                if (lVar46 == 3) {
LAB_004ae3aa:
                  LogFatal(Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/loopsubdiv.cpp"
                           ,0x39,"Basic logic error in SDFace::vnum()");
                }
              }
              pSVar31 = pSVar31->children[lVar46];
            }
            pSVar30->children[uVar45]->f[uVar48] = pSVar31;
            uVar45 = uVar54;
          } while (uVar54 != 3);
          ppSVar37 = ppSVar37 + 1;
          ppSVar53 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        } while (ppSVar37 != ppSVar25);
        for (; ppSVar53 != ppSVar25; ppSVar53 = ppSVar53 + 1) {
          pSVar30 = *ppSVar53;
          lVar46 = 1;
          do {
            register0x00001200 = (SDFace * [2])(ZEXT816(0) << 0x40);
            lVar50 = 0;
            if (lVar46 != 3) {
              lVar50 = lVar46;
            }
            pSVar30->f[lVar46 + 2]->v[lVar46 + -1] = pSVar30->v[lVar46 + -1]->child;
            pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = &pSVar30->v[lVar46 + -1]->p;
            pSVar38 = pSVar30->v[lVar50];
            pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 pLimit.
                 super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (pSVar38 < pLimit.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
              pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start = &pSVar38->p;
            }
            if (pLimit.
                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish < pSVar38) {
              pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = &pSVar38->p;
            }
            in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
            ppSVar35 = std::
                       map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                       ::operator[]((map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                                     *)&edgeVerts._M_t,(key_type *)&pLimit);
            auVar58 = in_ZMM1._0_16_;
            pSVar22 = *ppSVar35;
            pSVar30->f[lVar46 + 2]->v[lVar50] = pSVar22;
            pSVar30->children[lVar50]->v[lVar46 + -1] = pSVar22;
            pSVar30->children[3]->v[lVar46 + -1] = pSVar22;
            lVar46 = lVar46 + 1;
          } while (lVar46 != 4);
        }
      }
      in_ZMM1 = ZEXT1664(auVar58);
      std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::operator=
                (&f,(vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)&Ns);
      std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::operator=(&v,&newVertices);
      std::
      _Rb_tree<pbrt::SDEdge,_std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>,_std::_Select1st<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
      ::~_Rb_tree(&edgeVerts._M_t);
      if (newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(newVertices.
                        super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)newVertices.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)newVertices.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(Ns.
                        super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)Ns.
                              super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)Ns.
                              super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      iVar43 = iVar43 + 1;
    } while (iVar43 != nLevels);
  }
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
            (&pLimit,(long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)&edgeVerts);
  if (v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
  }
  else {
    uVar45 = 0;
    do {
      auVar86 = in_ZMM1._4_60_;
      pSVar38 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar45];
      if (pSVar38->boundary == true) {
        auVar77 = (undefined1  [56])0x0;
        PVar94 = weightBoundary(pSVar38,0.2);
        in_ZMM1._0_4_ = PVar94.super_Tuple3<pbrt::Point3,_float>.z;
        in_ZMM1._4_60_ = auVar86;
        auVar73._0_8_ = PVar94.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar73._8_56_ = auVar77;
        auVar58 = auVar73._0_16_;
      }
      else {
        pSVar30 = pSVar38->startFace;
        iVar43 = 0;
        do {
          pSVar30 = SDFace::nextFace(pSVar30,pSVar38);
          iVar43 = iVar43 + 1;
        } while (pSVar30 != pSVar38->startFace);
        auVar86 = (undefined1  [60])0x0;
        auVar77 = ZEXT856(0);
        PVar94 = weightOneRing(pSVar38,1.0 / ((float)((uint)(iVar43 == 3) * 0x40000000 +
                                                     (uint)(iVar43 != 3) *
                                                     (int)(3.0 / ((3.0 / ((float)iVar43 * 8.0)) *
                                                                 8.0))) + (float)iVar43));
        in_ZMM1._0_4_ = PVar94.super_Tuple3<pbrt::Point3,_float>.z;
        in_ZMM1._4_60_ = auVar86;
        auVar74._0_8_ = PVar94.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar74._8_56_ = auVar77;
        auVar58 = auVar74._0_16_;
      }
      uVar54 = uVar45 + 1;
      uVar10 = vmovlps_avx(auVar58);
      pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar45].super_Tuple3<pbrt::Point3,_float>.x =
           (float)(int)uVar10;
      pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar45].super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar10 >> 0x20);
      pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar45].super_Tuple3<pbrt::Point3,_float>.z = in_ZMM1._0_4_;
      __n = (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
      uVar45 = uVar54;
    } while (uVar54 < __n);
  }
  if (v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar46 = 0;
    uVar45 = 0;
    do {
      pSVar38 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar45];
      uVar45 = uVar45 + 1;
      (pSVar38->p).super_Tuple3<pbrt::Point3,_float>.z =
           *(float *)((long)&((pLimit.
                               super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_Tuple3<pbrt::Point3,_float>).z + lVar46);
      uVar10 = *(undefined8 *)
                ((long)&((pLimit.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_Tuple3<pbrt::Point3,_float>).x + lVar46);
      lVar46 = lVar46 + 0xc;
      (pSVar38->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar10;
      (pSVar38->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar10 >> 0x20);
      __n = (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    } while (uVar45 < __n);
  }
  Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0);
  Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::reserve(&Ns,__n);
  newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0);
  newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0xc0);
  ppSVar36 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  auVar75 = ZEXT1664(ZEXT816(0) << 0x40);
  newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((long)newVertices.
                       super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0xc0);
  *(undefined1 (*) [64])
   ((long)newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
          _M_impl.super__Vector_impl_data._M_start + 0x80) = auVar75;
  *(undefined1 (*) [64])
   ((long)newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
          _M_impl.super__Vector_impl_data._M_start + 0x40) = auVar75;
  *(undefined1 (*) [64])
   newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
   super__Vector_impl_data._M_start = auVar75;
  newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  ppSVar47 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    ppSVar37 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppSVar47 == ppSVar36) {
      lVar46 = (long)f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&vert,lVar46 * 3,(allocator_type *)&edgeVerts)
      ;
      pSVar38 = vert;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar50 = (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar56 = 0;
        lVar51 = 0;
        do {
          pmVar40 = std::
                    map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                    ::operator[]((map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                                  *)&edgeVerts,
                                 (key_type *)
                                 ((long)v.
                                        super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar56));
          *pmVar40 = (mapped_type)lVar51;
          lVar51 = lVar51 + 1;
          lVar56 = lVar56 + 8;
        } while (lVar50 + (ulong)(lVar50 == 0) != lVar51);
      }
      if (f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppSVar37) {
        lVar50 = 0;
        do {
          lVar56 = 0;
          do {
            pfVar41 = (float *)std::
                               map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                               ::operator[]((map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                                             *)&edgeVerts,
                                            (key_type *)
                                            ((long)f.
                                                  super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar50]
                                                  ->v + lVar56));
            lVar56 = lVar56 + 8;
            (pSVar38->p).super_Tuple3<pbrt::Point3,_float>.x = *pfVar41;
            pSVar38 = (SDVertex *)&(pSVar38->p).super_Tuple3<pbrt::Point3,_float>.y;
          } while (lVar56 != 0x18);
          lVar50 = lVar50 + 1;
        } while (lVar50 != lVar46 + (ulong)(lVar46 == 0));
      }
      local_88.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_88.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      iVar43 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                         (alloc_local.memoryResource,0x40,8);
      pstd::pmr::polymorphic_allocator<std::byte>::
      construct<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>>
                (&alloc_local,(TriangleMesh *)CONCAT44(extraout_var_02,iVar43),local_68,
                 &reverseOrientation_local,(vector<int,_std::allocator<int>_> *)&vert,&pLimit,
                 &local_88,&Ns,&local_a8,&local_d8);
      if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a8.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.
                        super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<pbrt::SDVertex_*,_std::pair<pbrt::SDVertex_*const,_int>,_std::_Select1st<std::pair<pbrt::SDVertex_*const,_int>_>,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
      ::~_Rb_tree((_Rb_tree<pbrt::SDVertex_*,_std::pair<pbrt::SDVertex_*const,_int>,_std::_Select1st<std::pair<pbrt::SDVertex_*const,_int>_>,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                   *)&edgeVerts);
      if (vert != (SDVertex *)0x0) {
        operator_delete(vert,(long)local_200 - (long)vert);
      }
      if (newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(newVertices.
                        super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)newVertices.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)newVertices.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(Ns.
                        super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)Ns.
                              super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)Ns.
                              super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(pLimit.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)pLimit.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)pLimit.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pstd::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(&resource);
      if (v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)v.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)v.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
      ::~_Rb_tree(&edges._M_t);
      operator_delete__(pp_Var29);
      operator_delete__(pp_Var27);
      if (faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)faces.
                              super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)faces.
                              super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vertices.
                        super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)vertices.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vertices.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return (TriangleMesh *)CONCAT44(extraout_var_02,iVar43);
    }
    pSVar38 = *ppSVar47;
    pSVar30 = pSVar38->startFace;
    if (pSVar38->boundary == false) {
      uVar45 = 0;
      do {
        pSVar30 = SDFace::nextFace(pSVar30,pSVar38);
        uVar45 = (ulong)((int)uVar45 + 1);
      } while (pSVar30 != pSVar38->startFace);
    }
    else {
      uVar45 = 0;
      do {
        pSVar30 = SDFace::nextFace(pSVar30,pSVar38);
        uVar45 = (ulong)((int)uVar45 + 1);
      } while (pSVar30 != (SDFace *)0x0);
      pSVar30 = pSVar38->startFace;
      do {
        pSVar30 = SDFace::prevFace(pSVar30,pSVar38);
        uVar45 = (ulong)((int)uVar45 + 1);
      } while (pSVar30 != (SDFace *)0x0);
    }
    iVar43 = (int)uVar45;
    if ((int)((ulong)((long)newVertices.
                            super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)newVertices.
                           super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 < iVar43) {
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::resize
                ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)&newVertices,
                 (long)iVar43);
    }
    SDVertex::oneRing(pSVar38,(Point3f *)
                              newVertices.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    if (pSVar38->boundary == false) {
      lVar46 = 8;
      auVar75 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar92 = ZEXT816(0) << 0x40;
      uVar54 = 0;
      _local_288 = ZEXT812(0);
      fStack_27c = 0.0;
      local_258 = ZEXT416(0);
      do {
        fVar61 = ((float)(int)uVar54 * 6.2831855) / (float)iVar43;
        local_b8._0_4_ = fVar61;
        fVar61 = cosf(fVar61);
        uVar10 = *(undefined8 *)
                  ((long)newVertices.
                         super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar46 + -8);
        local_258 = ZEXT416((uint)((float)local_258._0_4_ +
                                  fVar61 * *(float *)((long)newVertices.
                                                                                                                        
                                                  super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar46
                                                  )));
        local_288._4_4_ = (float)local_288._4_4_ + fVar61 * (float)((ulong)uVar10 >> 0x20);
        local_288._0_4_ = (float)local_288._0_4_ + fVar61 * (float)uVar10;
        fStack_280 = fStack_280 + fVar61 * 0.0;
        fStack_27c = fStack_27c + fVar61 * 0.0;
        fVar61 = sinf((float)local_b8._0_4_);
        local_198 = auVar92._0_4_;
        fStack_194 = auVar92._4_4_;
        fStack_190 = auVar92._8_4_;
        fStack_18c = auVar92._12_4_;
        local_188 = auVar75._0_4_;
        uVar54 = uVar54 + 1;
        uVar10 = *(undefined8 *)
                  ((long)newVertices.
                         super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar46 + -8);
        pfVar41 = (float *)((long)newVertices.
                                  super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar46);
        lVar46 = lVar46 + 0xc;
        local_188 = local_188 + fVar61 * *pfVar41;
        auVar75 = ZEXT464((uint)local_188);
        auVar91 = ZEXT416((uint)local_188);
        auVar92._0_4_ = local_198 + fVar61 * (float)uVar10;
        auVar92._4_4_ = fStack_194 + fVar61 * (float)((ulong)uVar10 >> 0x20);
        auVar92._8_4_ = fStack_190 + fVar61 * 0.0;
        auVar92._12_4_ = fStack_18c + fVar61 * 0.0;
      } while (uVar45 != uVar54);
    }
    else {
      lVar46 = (long)(iVar43 + -1);
      pSVar33 = *newVertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = pSVar33;
      auVar80._8_8_ = 0;
      auVar80._0_8_ =
           *(ulong *)((long)newVertices.
                            super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar46 * 0xc);
      _local_288 = vsubps_avx(auVar80,auVar66);
      fVar61 = *(float *)(newVertices.
                          super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                          _M_impl.super__Vector_impl_data._M_start + 1);
      local_258 = ZEXT416((uint)(*(float *)((long)newVertices.
                                                  super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                           lVar46 * 0xc + 8) - fVar61));
      if (iVar43 == 4) {
        fVar60 = (pSVar38->p).super_Tuple3<pbrt::Point3,_float>.z;
        fVar60 = ((((*(float *)((long)newVertices.
                                      super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 0x14) +
                    *(float *)((long)newVertices.
                                     super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 0x14)) - fVar61) +
                  *(float *)(newVertices.
                             super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + 4) +
                  *(float *)(newVertices.
                             super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + 4)) -
                 *(float *)((long)newVertices.
                                  super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 0x2c)) -
                 (fVar60 + fVar60);
        auVar87._8_8_ = 0;
        auVar87._0_8_ =
             *(ulong *)((long)newVertices.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x24);
        fVar61 = (float)*(undefined8 *)
                         ((long)newVertices.
                                super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0xc);
        fVar62 = (float)((ulong)*(undefined8 *)
                                 ((long)newVertices.
                                        super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 0xc) >> 0x20);
        auVar82._0_4_ = fVar61 + fVar61;
        auVar82._4_4_ = fVar62 + fVar62;
        auVar82._8_8_ = 0;
        auVar58 = vsubps_avx(auVar82,auVar66);
        fVar61 = SUB84(newVertices.
                       super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[3],0);
        fVar62 = (float)((ulong)newVertices.
                                super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[3] >> 0x20);
        auVar69._0_4_ = auVar58._0_4_ + fVar61 + fVar61;
        auVar69._4_4_ = auVar58._4_4_ + fVar62 + fVar62;
        auVar69._8_4_ = auVar58._8_4_ + 0.0;
        auVar69._12_4_ = auVar58._12_4_ + 0.0;
        auVar67 = vsubps_avx(auVar69,auVar87);
LAB_004ade99:
        auVar91 = ZEXT416((uint)fVar60);
        uVar9 = (pSVar38->p).super_Tuple3<pbrt::Point3,_float>.x;
        uVar19 = (pSVar38->p).super_Tuple3<pbrt::Point3,_float>.y;
        auVar83._0_4_ = (float)uVar9 + (float)uVar9;
        auVar83._4_4_ = (float)uVar19 + (float)uVar19;
        auVar83._8_8_ = 0;
        auVar92 = vsubps_avx(auVar67,auVar83);
      }
      else if (iVar43 == 3) {
        auVar68._8_8_ = 0;
        auVar68._0_8_ =
             *(ulong *)((long)newVertices.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0xc);
        uVar8 = (pSVar38->p).super_Tuple3<pbrt::Point3,_float>.x;
        uVar18 = (pSVar38->p).super_Tuple3<pbrt::Point3,_float>.y;
        auVar81._4_4_ = uVar18;
        auVar81._0_4_ = uVar8;
        auVar81._8_8_ = 0;
        auVar92 = vsubps_avx(auVar68,auVar81);
        auVar91 = ZEXT416((uint)(*(float *)((long)newVertices.
                                                  super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 0x14)
                                - (pSVar38->p).super_Tuple3<pbrt::Point3,_float>.z));
      }
      else {
        if (iVar43 == 2) {
          fVar60 = (pSVar38->p).super_Tuple3<pbrt::Point3,_float>.z;
          fVar60 = (fVar61 + *(float *)((long)newVertices.
                                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 0x14)) -
                   (fVar60 + fVar60);
          auVar67._0_4_ =
               SUB84(pSVar33,0) +
               (float)*(undefined8 *)
                       ((long)newVertices.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0xc);
          auVar67._4_4_ =
               (float)((ulong)pSVar33 >> 0x20) +
               (float)((ulong)*(undefined8 *)
                               ((long)newVertices.
                                      super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 0xc) >> 0x20);
          auVar67._8_8_ = 0;
          goto LAB_004ade99;
        }
        fVar60 = 3.1415927 / (float)(iVar43 + -1);
        fVar61 = sinf(fVar60);
        uVar10 = *(undefined8 *)
                  ((long)newVertices.
                         super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar46 * 0xc);
        auVar88._0_4_ =
             fVar61 * (SUB84(*newVertices.
                              super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,0) + (float)uVar10);
        auVar88._4_4_ =
             fVar61 * ((float)((ulong)*newVertices.
                                       super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 0x20) +
                      (float)((ulong)uVar10 >> 0x20));
        auVar88._8_4_ = fVar61 * 0.0;
        auVar88._12_4_ = fVar61 * 0.0;
        fVar61 = fVar61 * (*(float *)(newVertices.
                                      super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1) +
                          *(float *)((long)newVertices.
                                           super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                    lVar46 * 0xc + 8));
        if (2 < iVar43) {
          lVar56 = 1;
          lVar50 = 0x14;
          do {
            local_b8 = ZEXT416((uint)fVar61);
            auVar76._0_4_ = cosf(fVar60);
            auVar76._4_60_ = extraout_var_03;
            auVar58 = vfmadd132ss_fma(auVar76._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                      ZEXT416(0x40000000));
            fVar62 = sinf((float)(int)lVar56 * fVar60);
            fVar62 = fVar62 * auVar58._0_4_;
            local_198 = auVar88._0_4_;
            fStack_194 = auVar88._4_4_;
            fStack_190 = auVar88._8_4_;
            fStack_18c = auVar88._12_4_;
            lVar56 = lVar56 + 1;
            uVar10 = *(undefined8 *)
                      ((long)newVertices.
                             super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar50 + -8);
            pfVar41 = (float *)((long)newVertices.
                                      super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar50);
            lVar50 = lVar50 + 0xc;
            fVar61 = (float)local_b8._0_4_ + fVar62 * *pfVar41;
            auVar88._0_4_ = local_198 + fVar62 * (float)uVar10;
            auVar88._4_4_ = fStack_194 + fVar62 * (float)((ulong)uVar10 >> 0x20);
            auVar88._8_4_ = fStack_190 + fVar62 * 0.0;
            auVar88._12_4_ = fStack_18c + fVar62 * 0.0;
          } while (lVar46 != lVar56);
        }
        auVar92._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
        auVar92._8_4_ = (float)(auVar88._8_4_ ^ 0x80000000);
        auVar92._12_4_ = (float)(auVar88._12_4_ ^ 0x80000000);
        auVar91._0_4_ = -fVar61;
        auVar91._4_4_ = 0x80000000;
        auVar91._8_4_ = 0x80000000;
        auVar91._12_4_ = 0x80000000;
      }
    }
    auVar58 = vmovshdup_avx(auVar92);
    auVar59 = vmovshdup_avx(_local_288);
    auVar84 = ZEXT416((uint)(auVar58._0_4_ * local_258._0_4_));
    auVar59 = vfmsub213ss_fma(auVar59,auVar91,auVar84);
    auVar58 = vfnmadd213ss_fma(auVar58,local_258,auVar84);
    edgeVerts._M_t._M_impl._0_4_ = auVar59._0_4_ + auVar58._0_4_;
    auVar58 = vpermt2ps_avx512vl(_local_288,SUB6416(ZEXT464(4),0),local_258);
    auVar59 = vpermt2ps_avx512vl(auVar92,SUB6416(ZEXT464(4),0),auVar91);
    auVar85._0_4_ = auVar59._0_4_ * local_288._0_4_;
    auVar85._4_4_ = auVar59._4_4_ * local_288._4_4_;
    auVar85._8_4_ = auVar59._8_4_ * local_288._8_4_;
    auVar85._12_4_ = auVar59._12_4_ * local_288._12_4_;
    auVar58 = vfmsub213ps_fma(auVar58,auVar92,auVar85);
    auVar59 = vfnmadd213ps_fma(auVar59,_local_288,auVar85);
    auVar70._0_4_ = auVar58._0_4_ + auVar59._0_4_;
    auVar70._4_4_ = auVar58._4_4_ + auVar59._4_4_;
    auVar70._8_4_ = auVar58._8_4_ + auVar59._8_4_;
    auVar70._12_4_ = auVar58._12_4_ + auVar59._12_4_;
    uVar10 = vmovlps_avx(auVar70);
    edgeVerts._M_t._M_impl._4_4_ = SUB84(uVar10,0);
    edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (_Rb_tree_color)((ulong)uVar10 >> 0x20);
    if (Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>::
      _M_realloc_insert<pbrt::Normal3<float>>
                ((vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>> *)&Ns,
                 (iterator)
                 Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(Normal3<float> *)&edgeVerts);
    }
    else {
      ((Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Normal3,_float>).z =
           (float)edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      ((Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Normal3,_float>).x =
           (float)edgeVerts._M_t._M_impl._0_4_;
      ((Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Normal3,_float>).y =
           (float)edgeVerts._M_t._M_impl._4_4_;
      Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    ppSVar47 = ppSVar47 + 1;
  } while( true );
}

Assistant:

TriangleMesh *LoopSubdivide(const Transform *renderFromObject, bool reverseOrientation,
                            int nLevels, pstd::span<const int> vertexIndices,
                            pstd::span<const Point3f> p, Allocator alloc) {
    std::vector<SDVertex *> vertices;
    std::vector<SDFace *> faces;
    // Allocate _LoopSubdiv_ vertices and faces
    std::unique_ptr<SDVertex[]> verts = std::make_unique<SDVertex[]>(p.size());
    for (int i = 0; i < p.size(); ++i) {
        verts[i] = SDVertex(p[i]);
        vertices.push_back(&verts[i]);
    }
    size_t nFaces = vertexIndices.size() / 3;
    std::unique_ptr<SDFace[]> fs = std::make_unique<SDFace[]>(nFaces);
    for (int i = 0; i < nFaces; ++i)
        faces.push_back(&fs[i]);

    // Set face to vertex pointers
    const int *vp = vertexIndices.data();
    for (size_t i = 0; i < nFaces; ++i, vp += 3) {
        SDFace *f = faces[i];
        for (int j = 0; j < 3; ++j) {
            SDVertex *v = vertices[vp[j]];
            f->v[j] = v;
            v->startFace = f;
        }
    }

    // Set neighbor pointers in _faces_
    std::set<SDEdge> edges;
    for (int i = 0; i < nFaces; ++i) {
        SDFace *f = faces[i];
        for (int edgeNum = 0; edgeNum < 3; ++edgeNum) {
            // Update neighbor pointer for _edgeNum_
            int v0 = edgeNum, v1 = NEXT(edgeNum);
            SDEdge e(f->v[v0], f->v[v1]);
            if (edges.find(e) == edges.end()) {
                // Handle new edge
                e.f[0] = f;
                e.f0edgeNum = edgeNum;
                edges.insert(e);
            } else {
                // Handle previously seen edge
                e = *edges.find(e);
                e.f[0]->f[e.f0edgeNum] = f;
                f->f[edgeNum] = e.f[0];
                edges.erase(e);
            }
        }
    }

    // Finish vertex initialization
    for (size_t i = 0; i < p.size(); ++i) {
        SDVertex *v = vertices[i];
        SDFace *f = v->startFace;
        do {
            f = f->nextFace(v);
        } while ((f != nullptr) && f != v->startFace);
        v->boundary = (f == nullptr);
        if (!v->boundary && v->valence() == 6)
            v->regular = true;
        else if (v->boundary && v->valence() == 4)
            v->regular = true;
        else
            v->regular = false;
    }

    // Refine _LoopSubdiv_ into triangles
    std::vector<SDFace *> f = faces;
    std::vector<SDVertex *> v = vertices;
    pstd::pmr::monotonic_buffer_resource resource;
    Allocator vertexFaceAllocator(&resource);

    for (int i = 0; i < nLevels; ++i) {
        // Update _f_ and _v_ for next level of subdivision
        std::vector<SDFace *> newFaces;
        std::vector<SDVertex *> newVertices;

        // Allocate next level of children in mesh tree
        for (SDVertex *vertex : v) {
            vertex->child = vertexFaceAllocator.new_object<SDVertex>();
            vertex->child->regular = vertex->regular;
            vertex->child->boundary = vertex->boundary;
            newVertices.push_back(vertex->child);
        }
        for (SDFace *face : f) {
            for (int k = 0; k < 4; ++k) {
                face->children[k] = vertexFaceAllocator.new_object<SDFace>();
                newFaces.push_back(face->children[k]);
            }
        }

        // Update vertex positions and create new edge vertices

        // Update vertex positions for even vertices
        for (SDVertex *vertex : v) {
            if (!vertex->boundary) {
                // Apply one-ring rule for even vertex
                if (vertex->regular)
                    vertex->child->p = weightOneRing(vertex, 1.f / 16.f);
                else
                    vertex->child->p = weightOneRing(vertex, beta(vertex->valence()));
            } else {
                // Apply boundary rule for even vertex
                vertex->child->p = weightBoundary(vertex, 1.f / 8.f);
            }
        }

        // Compute new odd edge vertices
        std::map<SDEdge, SDVertex *> edgeVerts;
        for (SDFace *face : f) {
            for (int k = 0; k < 3; ++k) {
                // Compute odd vertex on _k_th edge
                SDEdge edge(face->v[k], face->v[NEXT(k)]);
                SDVertex *vert = edgeVerts[edge];
                if (vert == nullptr) {
                    // Create and initialize new odd vertex
                    vert = vertexFaceAllocator.new_object<SDVertex>();
                    newVertices.push_back(vert);
                    vert->regular = true;
                    vert->boundary = (face->f[k] == nullptr);
                    vert->startFace = face->children[3];

                    // Apply edge rules to compute new vertex position
                    if (vert->boundary) {
                        vert->p = 0.5f * edge.v[0]->p;
                        vert->p += 0.5f * edge.v[1]->p;
                    } else {
                        vert->p = 3.f / 8.f * edge.v[0]->p;
                        vert->p += 3.f / 8.f * edge.v[1]->p;
                        vert->p += 1.f / 8.f * face->otherVert(edge.v[0], edge.v[1])->p;
                        vert->p +=
                            1.f / 8.f * face->f[k]->otherVert(edge.v[0], edge.v[1])->p;
                    }
                    edgeVerts[edge] = vert;
                }
            }
        }

        // Update new mesh topology

        // Update even vertex face pointers
        for (SDVertex *vertex : v) {
            int vertNum = vertex->startFace->vnum(vertex);
            vertex->child->startFace = vertex->startFace->children[vertNum];
        }

        // Update face neighbor pointers
        for (SDFace *face : f) {
            for (int j = 0; j < 3; ++j) {
                // Update children _f_ pointers for siblings
                face->children[3]->f[j] = face->children[NEXT(j)];
                face->children[j]->f[NEXT(j)] = face->children[3];

                // Update children _f_ pointers for neighbor children
                SDFace *f2 = face->f[j];
                face->children[j]->f[j] =
                    f2 != nullptr ? f2->children[f2->vnum(face->v[j])] : nullptr;
                f2 = face->f[PREV(j)];
                face->children[j]->f[PREV(j)] =
                    f2 != nullptr ? f2->children[f2->vnum(face->v[j])] : nullptr;
            }
        }

        // Update face vertex pointers
        for (SDFace *face : f) {
            for (int j = 0; j < 3; ++j) {
                // Update child vertex pointer to new even vertex
                face->children[j]->v[j] = face->v[j]->child;

                // Update child vertex pointer to new odd vertex
                SDVertex *vert = edgeVerts[SDEdge(face->v[j], face->v[NEXT(j)])];
                face->children[j]->v[NEXT(j)] = vert;
                face->children[NEXT(j)]->v[j] = vert;
                face->children[3]->v[j] = vert;
            }
        }

        // Prepare for next level of subdivision
        f = newFaces;
        v = newVertices;
    }

    // Push vertices to limit surface
    std::vector<Point3f> pLimit(v.size());
    for (size_t i = 0; i < v.size(); ++i) {
        if (v[i]->boundary)
            pLimit[i] = weightBoundary(v[i], 1.f / 5.f);
        else
            pLimit[i] = weightOneRing(v[i], loopGamma(v[i]->valence()));
    }
    for (size_t i = 0; i < v.size(); ++i)
        v[i]->p = pLimit[i];

    // Compute vertex tangents on limit surface
    std::vector<Normal3f> Ns;
    Ns.reserve(v.size());
    std::vector<Point3f> pRing(16, Point3f());
    for (SDVertex *vertex : v) {
        Vector3f S(0, 0, 0), T(0, 0, 0);
        int valence = vertex->valence();
        if (valence > (int)pRing.size())
            pRing.resize(valence);
        vertex->oneRing(&pRing[0]);
        if (!vertex->boundary) {
            // Compute tangents of interior face
            for (int j = 0; j < valence; ++j) {
                S += std::cos(2 * Pi * j / valence) * Vector3f(pRing[j]);
                T += std::sin(2 * Pi * j / valence) * Vector3f(pRing[j]);
            }
        } else {
            // Compute tangents of boundary face
            S = pRing[valence - 1] - pRing[0];
            if (valence == 2)
                T = Vector3f(pRing[0] + pRing[1] - 2 * vertex->p);
            else if (valence == 3)
                T = pRing[1] - vertex->p;
            else if (valence == 4)  // regular
                T = Vector3f(-1 * pRing[0] + 2 * pRing[1] + 2 * pRing[2] + -1 * pRing[3] +
                             -2 * vertex->p);
            else {
                Float theta = Pi / float(valence - 1);
                T = Vector3f(std::sin(theta) * (pRing[0] + pRing[valence - 1]));
                for (int k = 1; k < valence - 1; ++k) {
                    Float wt = (2 * std::cos(theta) - 2) * std::sin((k)*theta);
                    T += Vector3f(wt * pRing[k]);
                }
                T = -T;
            }
        }
        Ns.push_back(Normal3f(Cross(S, T)));
    }

    // Create triangle mesh from subdivision mesh
    {
        size_t ntris = f.size();
        std::vector<int> verts(3 * ntris);
        int *vp = verts.data();
        size_t totVerts = v.size();
        std::map<SDVertex *, int> usedVerts;
        for (size_t i = 0; i < totVerts; ++i)
            usedVerts[v[i]] = i;
        for (size_t i = 0; i < ntris; ++i) {
            for (int j = 0; j < 3; ++j) {
                *vp = usedVerts[f[i]->v[j]];
                ++vp;
            }
        }
        return alloc.new_object<TriangleMesh>(*renderFromObject, reverseOrientation,
                                              verts, pLimit, std::vector<Vector3f>(), Ns,
                                              std::vector<Point2f>(), std::vector<int>());
    }
}